

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O3

Point2f __thiscall pbrt::SobolSampler::Get2D(SobolSampler *this)

{
  undefined1 auVar1 [16];
  float fVar2;
  undefined8 uVar3;
  bool bVar4;
  Tuple2<pbrt::Point2,_float> TVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  Point2f u;
  Float local_40 [4];
  
  iVar7 = this->dimension;
  if (0x3fe < iVar7) {
    iVar7 = 2;
    this->dimension = 2;
  }
  local_40[3] = sampleDimension(this,iVar7);
  local_40[1] = sampleDimension(this,this->dimension + 1);
  local_40[0] = local_40[3];
  iVar7 = this->dimension;
  if (iVar7 == 0) {
    bVar6 = true;
    do {
      bVar4 = bVar6;
      uVar8 = (ulong)(((byte)~bVar4 & 1) << 2);
      *(float *)((long)local_40 + uVar8) =
           (float)this->resolution * *(float *)((long)local_40 + uVar8);
      if (Get2D()::reg == '\0') {
        iVar7 = __cxa_guard_acquire(&Get2D()::reg);
        if (iVar7 != 0) {
          StatRegisterer::StatRegisterer
                    ((StatRegisterer *)&Get2D()::reg,
                     Get2D()::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,
                     (PixelAccumFunc)0x0);
          __cxa_guard_release(&Get2D()::reg);
        }
      }
      *(long *)(in_FS_OFFSET + -0x660) = *(long *)(in_FS_OFFSET + -0x660) + 1;
      if (*(float *)((long)local_40 + uVar8) <
          (float)*(int *)((long)&(this->pixel).super_Tuple2<pbrt::Point2,_int>.x + uVar8)) {
        *(long *)(in_FS_OFFSET + -0x668) = *(long *)(in_FS_OFFSET + -0x668) + 1;
      }
      if (Get2D()::reg == '\0') {
        iVar7 = __cxa_guard_acquire(&Get2D()::reg);
        if (iVar7 != 0) {
          StatRegisterer::StatRegisterer
                    ((StatRegisterer *)&Get2D()::reg,
                     Get2D()::{lambda(pbrt::StatsAccumulator&)#2}::StatsAccumulator__,
                     (PixelAccumFunc)0x0);
          __cxa_guard_release(&Get2D()::reg);
        }
      }
      *(long *)(in_FS_OFFSET + -0x650) = *(long *)(in_FS_OFFSET + -0x650) + 1;
      fVar2 = *(float *)((long)local_40 + uVar8) -
              (float)*(int *)((long)&(this->pixel).super_Tuple2<pbrt::Point2,_int>.x + uVar8);
      if (1.0 < fVar2) {
        *(long *)(in_FS_OFFSET + -0x658) = *(long *)(in_FS_OFFSET + -0x658) + 1;
      }
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar2),ZEXT816(0) << 0x40,1);
      auVar1 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),ZEXT416((uint)fVar2));
      *(uint *)((long)local_40 + uVar8) = (uint)!(bool)((byte)uVar3 & 1) * auVar1._0_4_;
      bVar6 = false;
    } while (bVar4);
    iVar7 = this->dimension;
  }
  this->dimension = iVar7 + 2;
  TVar5.y = local_40[1];
  TVar5.x = local_40[0];
  return (Point2f)TVar5;
}

Assistant:

PBRT_CPU_GPU
    Point2f Get2D() {
        if (dimension + 1 >= NSobolDimensions)
            dimension = 2;

        Point2f u(sampleDimension(dimension), sampleDimension(dimension + 1));
        if (dimension == 0) {
            // Remap Sobol$'$ dimensions used for pixel samples
            for (int dim = 0; dim < 2; ++dim) {
                u[dim] = u[dim] * resolution;
                CHECK_RARE(1e-7, u[dim] - pixel[dim] < 0);
                CHECK_RARE(1e-7, u[dim] - pixel[dim] > 1);
                u[dim] = Clamp(u[dim] - pixel[dim], (Float)0, OneMinusEpsilon);
            }
        }
        dimension += 2;
        return u;
    }